

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5AllocateSegid(Fts5Index *p,Fts5Structure *pStruct)

{
  Fts5StructureSegment *pFVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint *puVar8;
  long lVar9;
  u32 aUsed [63];
  uint local_118 [66];
  
  iVar3 = 0;
  if (p->rc != 0) {
    return 0;
  }
  puVar8 = local_118;
  if (pStruct->nSegment < 2000) {
    memset(local_118,0,0xfc);
    iVar3 = pStruct->nLevel;
    if (0 < (long)iVar3) {
      lVar7 = 0;
      do {
        lVar5 = (long)pStruct->aLevel[lVar7].nSeg;
        if (0 < lVar5) {
          pFVar1 = pStruct->aLevel[lVar7].aSeg;
          lVar9 = 0;
          do {
            uVar4 = *(int *)((long)&pFVar1->iSegid + lVar9) - 1;
            if (uVar4 < 2000) {
              local_118[uVar4 >> 5] = local_118[uVar4 >> 5] | 1 << ((byte)uVar4 & 0x1f);
            }
            lVar9 = lVar9 + 0xc;
          } while (lVar5 * 0xc != lVar9);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != iVar3);
    }
    iVar3 = -0x20;
    do {
      uVar4 = *puVar8;
      iVar3 = iVar3 + 0x20;
      puVar8 = puVar8 + 1;
    } while (uVar4 == 0xffffffff);
    uVar6 = 0;
    do {
      iVar3 = iVar3 + 1;
      uVar2 = uVar6 & 0x1f;
      uVar6 = uVar6 + 1;
    } while ((uVar4 >> uVar2 & 1) != 0);
  }
  else {
    p->rc = 0xd;
  }
  return iVar3;
}

Assistant:

static int fts5AllocateSegid(Fts5Index *p, Fts5Structure *pStruct){
  int iSegid = 0;

  if( p->rc==SQLITE_OK ){
    if( pStruct->nSegment>=FTS5_MAX_SEGMENT ){
      p->rc = SQLITE_FULL;
    }else{
      /* FTS5_MAX_SEGMENT is currently defined as 2000. So the following
      ** array is 63 elements, or 252 bytes, in size.  */
      u32 aUsed[(FTS5_MAX_SEGMENT+31) / 32];
      int iLvl, iSeg;
      int i;
      u32 mask;
      memset(aUsed, 0, sizeof(aUsed));
      for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
        for(iSeg=0; iSeg<pStruct->aLevel[iLvl].nSeg; iSeg++){
          int iId = pStruct->aLevel[iLvl].aSeg[iSeg].iSegid;
          if( iId<=FTS5_MAX_SEGMENT && iId>0 ){
            aUsed[(iId-1) / 32] |= (u32)1 << ((iId-1) % 32);
          }
        }
      }

      for(i=0; aUsed[i]==0xFFFFFFFF; i++);
      mask = aUsed[i];
      for(iSegid=0; mask & ((u32)1 << iSegid); iSegid++);
      iSegid += 1 + i*32;

#ifdef SQLITE_DEBUG
      for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
        for(iSeg=0; iSeg<pStruct->aLevel[iLvl].nSeg; iSeg++){
          assert_nc( iSegid!=pStruct->aLevel[iLvl].aSeg[iSeg].iSegid );
        }
      }
      assert_nc( iSegid>0 && iSegid<=FTS5_MAX_SEGMENT );

      {
        sqlite3_stmt *pIdxSelect = fts5IdxSelectStmt(p);
        if( p->rc==SQLITE_OK ){
          u8 aBlob[2] = {0xff, 0xff};
          sqlite3_bind_int(pIdxSelect, 1, iSegid);
          sqlite3_bind_blob(pIdxSelect, 2, aBlob, 2, SQLITE_STATIC);
          assert_nc( sqlite3_step(pIdxSelect)!=SQLITE_ROW );
          p->rc = sqlite3_reset(pIdxSelect);
          sqlite3_bind_null(pIdxSelect, 2);
        }
      }
#endif
    }
  }

  return iSegid;
}